

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_top_n_sigma_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_token_data *plVar1;
  unkuint9 Var2;
  float *pfVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  plVar1 = cur_p->data;
  uVar5 = cur_p->size;
  fVar10 = plVar1->logit;
  if (uVar5 == 0) {
    fVar8 = 0.0;
  }
  else {
    pfVar3 = &plVar1->logit;
    fVar8 = 0.0;
    uVar6 = uVar5;
    fVar7 = fVar10;
    do {
      fVar10 = *pfVar3;
      fVar8 = fVar8 + fVar10;
      if (fVar10 <= fVar7) {
        fVar10 = fVar7;
      }
      pfVar3 = pfVar3 + 3;
      uVar6 = uVar6 - 1;
      fVar7 = fVar10;
    } while (uVar6 != 0);
  }
  Var2 = (unkuint9)uVar5;
  fVar7 = 0.0;
  if (uVar5 != 0) {
    pfVar3 = &plVar1->logit;
    do {
      fVar9 = *pfVar3 - fVar8 / (float)(unkint9)Var2;
      fVar7 = fVar7 + fVar9 * fVar9;
      pfVar3 = pfVar3 + 3;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  pfVar3 = (float *)smpl->ctx;
  fVar7 = fVar7 / (float)(unkint9)Var2;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  sVar4 = cur_p->size;
  if (sVar4 != 0) {
    fVar10 = fVar10 - fVar7 * *pfVar3;
    pfVar3 = &cur_p->data->logit;
    do {
      if (*pfVar3 <= fVar10 && fVar10 != *pfVar3) {
        *pfVar3 = -INFINITY;
      }
      pfVar3 = pfVar3 + 3;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  llama_sampler_softmax_impl(cur_p);
  return;
}

Assistant:

static void llama_sampler_top_n_sigma_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_n_sigma *) smpl->ctx;

    // find max logit and calculate mean
    float max = cur_p->data[0].logit;
    float logits_sum = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit > max) {
            max = cur_p->data[i].logit;
        }
        logits_sum += cur_p->data[i].logit;
    }
    float mean = logits_sum/cur_p->size;

    // calculate standard deviation
    float acc = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        acc += pow(cur_p->data[i].logit - mean, 2);
    }
    float std = sqrt(acc/cur_p->size);

    //apply mask
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit < max - (ctx->n * std)) {
            cur_p->data[i].logit = -INFINITY;
        }
    }
    llama_sampler_softmax_impl(cur_p);
}